

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGMSHReadMesh.cpp
# Opt level: O2

void __thiscall
TPZGMSHReadMesh::ReadMesh3D
          (TPZGMSHReadMesh *this,char *meshfile,TPZStack<TPZGeoEl_*,_10> *elemlist,
          TPZStack<TPZGeoElSide,_10> *elembclist)

{
  int iVar1;
  istream *piVar2;
  TPZGeoNode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar3;
  TPZGMSHReadMesh *this_01;
  int64_t nvert;
  int64_t index;
  TPZStack<TPZGeoEl_*,_10> *local_490;
  _func_int **local_488;
  TPZStack<TPZGeoElSide,_10> *local_480;
  int64_t nmat;
  int64_t nnodes;
  TPZVec<long> nos;
  int64_t fgt1;
  TPZVec<long> nodes;
  int64_t numelem;
  TPZVec<double> coord;
  TPZGeoElSide local_3f8;
  TPZGeoElSide local_3e0;
  int64_t fgt2;
  int64_t numb;
  int64_t number;
  TPZStack<long,_10> Indexes;
  ifstream mesh;
  char title [256];
  
  this_01 = (TPZGMSHReadMesh *)&Indexes;
  local_490 = elemlist;
  local_480 = elembclist;
  TPZStack<long,_10>::TPZStack(&Indexes);
  Resequence(this_01,&Indexes,meshfile);
  std::ifstream::ifstream(&mesh,meshfile,_S_in);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&mesh,title);
  std::istream::_M_extract<long>((long *)&mesh);
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&this->fGeoMesh->fNodeVec,(int)nnodes);
  TPZVec<double>::TPZVec(&coord,3);
  for (lVar3 = 0; lVar3 < CONCAT44(nnodes._4_4_,(int)nnodes); lVar3 = lVar3 + 1) {
    std::istream::_M_extract<long>((long *)&mesh);
    piVar2 = std::istream::_M_extract<double>((double *)&mesh);
    piVar2 = std::istream::_M_extract<double>((double *)piVar2);
    std::istream::_M_extract<double>((double *)piVar2);
    this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                        (&(this->fGeoMesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,lVar3);
    TPZGeoNode::Initialize(this_00,&coord,this->fGeoMesh);
  }
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&mesh,title);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&mesh,title);
  std::istream::_M_extract<long>((long *)&mesh);
  nodes._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  nodes.fStore = (long *)0x0;
  nodes.fNElements = 0;
  nodes.fNAlloc = 0;
  TPZVec<long>::Resize(&nodes,3);
  TPZVec<long>::TPZVec(&nos,8);
  local_488 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  for (lVar3 = 0; lVar3 < numelem; lVar3 = lVar3 + 1) {
    piVar2 = std::istream::_M_extract<long>((long *)&mesh);
    piVar2 = std::istream::_M_extract<long>((long *)piVar2);
    piVar2 = std::istream::_M_extract<long>((long *)piVar2);
    piVar2 = std::istream::_M_extract<long>((long *)piVar2);
    std::istream::_M_extract<long>((long *)piVar2);
    for (lVar3 = 0; lVar3 < nvert; lVar3 = lVar3 + 1) {
      std::istream::_M_extract<long>((long *)&mesh);
    }
    if (nvert == 3) {
      for (lVar3 = 0; lVar3 < 3; lVar3 = lVar3 + 1) {
        nodes.fStore[lVar3] =
             Indexes.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[nos.fStore[lVar3] + -1];
      }
      TPZVec<long>::Resize(&nodes,3);
      iVar1 = (*(this->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                        (this->fGeoMesh,2,&nodes,1,&index,1);
      local_3e0.fGeoEl = (TPZGeoEl *)CONCAT44(extraout_var,iVar1);
      local_3e0.fSide = -(int)nmat;
      local_3e0.super_TPZSavable._vptr_TPZSavable = local_488;
      TPZStack<TPZGeoElSide,_10>::Push(local_480,&local_3e0);
    }
    else if (fgt1 == 4 || nvert != 4) {
      if (fgt1 == 4 && nvert == 4) {
        TPZVec<long>::Resize(&nodes,4);
        for (lVar3 = 0; lVar3 < nvert; lVar3 = lVar3 + 1) {
          nodes.fStore[lVar3] =
               Indexes.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
               [nos.fStore[lVar3] + -1];
        }
        iVar1 = (*(this->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (this->fGeoMesh,4,&nodes,1,&index,1);
        TPZStack<TPZGeoEl_*,_10>::Push(local_490,(TPZGeoEl *)CONCAT44(extraout_var_01,iVar1));
      }
      else if (nvert == 8) {
        TPZVec<long>::Resize(&nodes,8);
        for (lVar3 = 0; lVar3 < 8; lVar3 = lVar3 + 1) {
          nodes.fStore[lVar3] =
               Indexes.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore
               [nos.fStore[lVar3] + -1];
        }
        iVar1 = (*(this->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (this->fGeoMesh,7,&nodes,1,&index,1);
        TPZStack<TPZGeoEl_*,_10>::Push(local_490,(TPZGeoEl *)CONCAT44(extraout_var_02,iVar1));
      }
    }
    else {
      TPZVec<long>::Resize(&nodes,4);
      for (lVar3 = 0; lVar3 < nvert; lVar3 = lVar3 + 1) {
        nodes.fStore[lVar3] =
             Indexes.super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[nos.fStore[lVar3] + -1];
      }
      iVar1 = (*(this->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                        (this->fGeoMesh,3,&nodes,1,&index,1);
      local_3f8.fGeoEl = (TPZGeoEl *)CONCAT44(extraout_var_00,iVar1);
      local_3f8.fSide = -(int)nmat;
      local_3f8.super_TPZSavable._vptr_TPZSavable = local_488;
      TPZStack<TPZGeoElSide,_10>::Push(local_480,&local_3f8);
    }
  }
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&mesh,title);
  std::ifstream::close();
  TPZVec<long>::~TPZVec(&nos);
  TPZVec<long>::~TPZVec(&nodes);
  TPZVec<double>::~TPZVec(&coord);
  std::ifstream::~ifstream(&mesh);
  TPZManVector<long,_10>::~TPZManVector(&Indexes.super_TPZManVector<long,_10>);
  return;
}

Assistant:

void TPZGMSHReadMesh::ReadMesh3D(char *meshfile,TPZStack<TPZGeoEl *> &elemlist,TPZStack<TPZGeoElSide> &elembclist){
	
	//o GMSH pode não retornar os nós sequencialmente
	//nesse casso deveram ser resequenciados
	TPZStack<int64_t> Indexes;
	Resequence(Indexes,meshfile);
	std::ifstream mesh(meshfile);
	char title[256];
	int64_t nnodes,number;
	mesh >> title;//$NOD
	mesh >> nnodes;
	fGeoMesh->NodeVec().Resize(nnodes);   
	TPZVec<REAL> coord(3);
	int64_t i;
	for(i=0;i<nnodes;i++){
		mesh >> number;
		mesh >> coord[0] >> coord[1] >> coord[2];
		fGeoMesh->NodeVec()[i].Initialize(coord,*fGeoMesh);
	}
	mesh >> title;//$ENDNOD
	mesh >> title;//$ELM
	int64_t numelem;
	mesh >> numelem;
	TPZVec<int64_t> nodes;
	nodes.Resize(3);
	int64_t index;
	int64_t numb,fgt1,nmat,fgt2,nvert;
	TPZVec<int64_t> nos(8);//máximo do cubo
	for(i=0;i<numelem;i++){
		mesh >> numb >> fgt1 >> nmat >> fgt2 >> nvert;
		for(i=0;i<nvert;i++) mesh >> nos[i];
		if(nvert == 3){//triângulos
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			nodes.Resize(3);
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(ETriangle,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 != 4){//quadrilateros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(EQuadrilateral,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 == 4){//tetraedros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ETetraedro,nodes,1,index));
			continue;
		} else if(nvert == 8){//hexaedros
			nodes.Resize(8);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ECube,nodes,1,index));
			continue;
		}
	}
	mesh >> title;//$ENDELM
	mesh.close();
}